

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O3

json_null __thiscall json_deserializer::deserialize_null(json_deserializer *this)

{
  ulong uVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  ulong uVar4;
  ostream *poVar5;
  int iVar6;
  int *in_RSI;
  size_type sVar7;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_50,*(char *)(*(long *)(in_RSI + 2) + (long)*in_RSI));
  iVar6 = 3;
  do {
    uVar1 = (long)*in_RSI + 1;
    uVar4 = (long)*in_RSI;
    if (uVar1 < *(ulong *)(in_RSI + 4)) {
      *in_RSI = (int)uVar1;
      uVar4 = uVar1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_50,*(char *)(*(long *)(in_RSI + 2) + uVar4));
    sVar3 = local_50._M_string_length;
    _Var2._M_p = local_50._M_dataplus._M_p;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (local_50._M_string_length != 0) {
    sVar7 = 0;
    do {
      iVar6 = tolower((int)_Var2._M_p[sVar7]);
      _Var2._M_p[sVar7] = (char)iVar6;
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_50,"null");
  if (iVar6 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Expected \'null\', found ",0x17);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  *(undefined ***)&this->reader = &PTR_get_type_0012da60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return (json_null)(json_element)this;
}

Assistant:

json_null deserialize_null() {
        string str;
        str += reader.current();
        int i = 1;
        while (i < 4) {
            reader.next();
            str += reader.current();
            i++;
        }
        transform(str.begin(), str.end(), str.begin(), ::tolower);
        if (str != "null") {
            cerr << "Expected 'null', found " << str << endl;
        }
        return json_null_instance;
    }